

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_f16c.cpp
# Opt level: O1

void ncnn::cast_fp32_to_fp16_sse_f16c(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  
  iVar2 = bottom_blob->c;
  if (0 < (long)iVar2) {
    uVar7 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar9 = 0;
    do {
      pauVar8 = (undefined1 (*) [32])
                (bottom_blob->cstep * lVar9 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar11 = (undefined1 (*) [16])
                 (top_blob->cstep * lVar9 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar7 < 8) {
        uVar5 = 0;
      }
      else {
        iVar4 = 7;
        do {
          auVar1 = vcvtps2ph_f16c(*pauVar8,8);
          *pauVar11 = auVar1;
          pauVar8 = pauVar8 + 1;
          pauVar11 = pauVar11 + 1;
          iVar4 = iVar4 + 8;
          uVar5 = uVar7 & 0xfffffff8;
        } while (iVar4 < (int)uVar7);
      }
      uVar6 = uVar5 | 3;
      while ((int)uVar6 < (int)uVar7) {
        vcvtps2ph_f16c(*(undefined1 (*) [16])*pauVar8,8);
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
        uVar6 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if (uVar7 - uVar5 != 0 && (int)uVar5 <= (int)uVar7) {
        lVar10 = 0;
        do {
          uVar3 = float32_to_float16(*(float *)(*pauVar8 + lVar10 * 4));
          *(unsigned_short *)(*pauVar11 + lVar10 * 2) = uVar3;
          lVar10 = lVar10 + 1;
        } while (uVar7 - uVar5 != (int)lVar10);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_f16c(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}